

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::
TestVector<CRIPEMD160,std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (CryptoTest *this,CRIPEMD160 *h,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  CRIPEMD160 *pCVar5;
  unsigned_long len;
  long lVar6;
  CRIPEMD160 *pCVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  byte bVar11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  check_type in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  assertion_result local_1b0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  undefined1 local_f8 [8];
  element_type *local_f0;
  shared_count sStack_e8;
  char **local_e0;
  CRIPEMD160 hasher;
  
  bVar11 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  local_f0 = (element_type *)0x0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "out.size() == h.OUTPUT_SIZE";
  local_1b0.m_message.px = (element_type *)0xb7a611;
  hasher.s[2]._0_1_ = 0;
  hasher.s._0_8_ = &PTR__lazy_ostream_0113a070;
  hasher._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_140 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  hasher.buf._4_8_ = &local_1b0;
  local_f8[0] = (class_property<bool>)
                (class_property<bool>)
                ((long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start == 0x14);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f8,(lazy_ostream *)&hasher,1,0,WARN,
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),(size_t)&local_148,0x25);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&hash,(long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start);
  pCVar5 = h;
  pCVar7 = &hasher;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(undefined8 *)pCVar7->s = *(undefined8 *)pCVar5->s;
    pCVar5 = (CRIPEMD160 *)((long)pCVar5 + (ulong)bVar11 * -0x10 + 8);
    pCVar7 = (CRIPEMD160 *)((long)pCVar7 + (ulong)bVar11 * -0x10 + 8);
  }
  pCVar5 = CRIPEMD160::Write(&hasher,(uchar *)(in->_M_dataplus)._M_p,in->_M_string_length);
  CRIPEMD160::Finalize
            (pCVar5,hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_158;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
             msg_00);
  local_f8[0] = (class_property<bool>)std::operator==(&hash,out);
  local_f0 = (element_type *)0x0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_1b0._0_8_ = "hash == out";
  local_1b0.m_message.px = (element_type *)0xc8faf5;
  hasher.s[2]._0_1_ = 0;
  hasher.s._0_8_ = &PTR__lazy_ostream_0113a070;
  hasher._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_170 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  hasher.buf._4_8_ = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f8,(lazy_ostream *)&hasher,1,0,WARN,
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),(size_t)&local_178,0x2a);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  for (iVar4 = 0; iVar4 != 0x20; iVar4 = iVar4 + 1) {
    pCVar5 = h;
    pCVar7 = &hasher;
    for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pCVar7->s = *(undefined8 *)pCVar5->s;
      pCVar5 = (CRIPEMD160 *)((long)pCVar5 + (ulong)bVar11 * -0x10 + 8);
      pCVar7 = (CRIPEMD160 *)((long)pCVar7 + (ulong)bVar11 * -0x10 + 8);
    }
    uVar10 = 0;
    while (lVar6 = in->_M_string_length - uVar10, uVar10 <= in->_M_string_length && lVar6 != 0) {
      len = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&(this->super_BasicTestingSetup).m_rng.super_RandomMixin<FastRandomContext>,
                       (lVar6 + 1U >> 1) + 1);
      CRIPEMD160::Write(&hasher,(uchar *)((in->_M_dataplus)._M_p + uVar10),len);
      uVar10 = len + uVar10;
      if (uVar10 != 0) {
        uVar2 = in->_M_string_length;
        if ((uVar10 <= uVar2 && uVar2 - uVar10 != 0) &&
           (uVar2 < ((long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_start) * 2 + uVar10)) {
          pCVar5 = &hasher;
          pCVar7 = (CRIPEMD160 *)local_f8;
          for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
            *(undefined8 *)pCVar7->s = *(undefined8 *)pCVar5->s;
            pCVar5 = (CRIPEMD160 *)((long)pCVar5 + (ulong)bVar11 * -0x10 + 8);
            pCVar7 = (CRIPEMD160 *)((long)pCVar7 + (ulong)bVar11 * -0x10 + 8);
          }
          pCVar5 = CRIPEMD160::Write((CRIPEMD160 *)local_f8,
                                     (uchar *)((in->_M_dataplus)._M_p + uVar10),uVar2 - uVar10);
          CRIPEMD160::Finalize
                    (pCVar5,hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          local_188 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
          ;
          local_180 = "";
          local_198 = &boost::unit_test::basic_cstring<char_const>::null;
          local_190 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_01.m_end = pvVar9;
          msg_01.m_begin = pvVar8;
          file_01.m_end = (iterator)0x37;
          file_01.m_begin = (iterator)&local_188;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_198,msg_01);
          bVar3 = std::operator==(&hash,out);
          local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)bVar3;
          local_1b0.m_message.px = (element_type *)0x0;
          local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_1c0 = "hash == out";
          local_1b8 = "";
          local_f0 = (element_type *)((ulong)local_f0 & 0xffffffffffffff00);
          local_f8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
          sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_e0 = &local_1c0;
          local_1d0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
          ;
          local_1c8 = "";
          pvVar8 = &DAT_00000001;
          pvVar9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_1b0,(lazy_ostream *)local_f8,1,0,WARN,
                     CONCAT44(iVar4,in_stack_fffffffffffffdf0),(size_t)&local_1d0,0x37);
          boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
        }
      }
    }
    CRIPEMD160::Finalize
              (&hasher,hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_1e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1d8 = "";
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = pvVar9;
    msg_02.m_begin = pvVar8;
    file_02.m_end = (iterator)0x3b;
    file_02.m_begin = (iterator)&local_1e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1f0,
               msg_02);
    bVar3 = std::operator==(&hash,out);
    local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar3;
    local_1b0.m_message.px = (element_type *)0x0;
    local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1c0 = "hash == out";
    local_1b8 = "";
    local_f0 = (element_type *)((ulong)local_f0 & 0xffffffffffffff00);
    local_f8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
    sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_e0 = &local_1c0;
    local_200 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1f8 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1b0,(lazy_ostream *)local_f8,1,0,WARN,
               CONCAT44(iVar4,in_stack_fffffffffffffdf0),(size_t)&local_200,0x3b);
    boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestVector(const Hasher &h, const In &in, const Out &out) {
    Out hash;
    BOOST_CHECK(out.size() == h.OUTPUT_SIZE);
    hash.resize(out.size());
    {
        // Test that writing the whole input string at once works.
        Hasher(h).Write((const uint8_t*)in.data(), in.size()).Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
    for (int i=0; i<32; i++) {
        // Test that writing the string broken up in random pieces works.
        Hasher hasher(h);
        size_t pos = 0;
        while (pos < in.size()) {
            size_t len = m_rng.randrange((in.size() - pos + 1) / 2 + 1);
            hasher.Write((const uint8_t*)in.data() + pos, len);
            pos += len;
            if (pos > 0 && pos + 2 * out.size() > in.size() && pos < in.size()) {
                // Test that writing the rest at once to a copy of a hasher works.
                Hasher(hasher).Write((const uint8_t*)in.data() + pos, in.size() - pos).Finalize(hash.data());
                BOOST_CHECK(hash == out);
            }
        }
        hasher.Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
}